

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ActionBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ActionBlockSyntax,slang::syntax::ActionBlockSyntax_const&>
          (BumpAllocator *this,ActionBlockSyntax *args)

{
  SyntaxNode *pSVar1;
  StatementSyntax *pSVar2;
  SyntaxKind SVar3;
  undefined4 uVar4;
  ActionBlockSyntax *pAVar5;
  
  pAVar5 = (ActionBlockSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ActionBlockSyntax *)this->endPtr < pAVar5 + 1) {
    pAVar5 = (ActionBlockSyntax *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pAVar5 + 1);
  }
  pAVar5->elseClause = args->elseClause;
  SVar3 = (args->super_SyntaxNode).kind;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  pSVar2 = args->statement;
  (pAVar5->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  pAVar5->statement = pSVar2;
  (pAVar5->super_SyntaxNode).kind = SVar3;
  *(undefined4 *)&(pAVar5->super_SyntaxNode).field_0x4 = uVar4;
  (pAVar5->super_SyntaxNode).parent = pSVar1;
  return pAVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }